

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::DescriptorDatabaseTest::AddToDatabaseWithError
          (DescriptorDatabaseTest *this,char *file_descriptor_text)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  pointer pDVar4;
  Message *in_RCX;
  char *in_R9;
  string_view input;
  string local_1c0;
  AssertHelper local_1a0;
  Message local_198;
  bool local_189;
  undefined1 local_188 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_158;
  Message local_150 [3];
  basic_string_view<char,_std::char_traits<char>_> local_138;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_;
  FileDescriptorProto file_proto;
  char *file_descriptor_text_local;
  DescriptorDatabaseTest *this_local;
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar_.message_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_138,file_descriptor_text);
  input._M_str = (char *)&gtest_ar_.message_;
  input._M_len = (size_t)local_138._M_str;
  local_121 = TextFormat::ParseFromString((TextFormat *)local_138._M_len,input,in_RCX);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_120,&local_121,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_120,
               (AssertionResult *)"TextFormat::ParseFromString(file_descriptor_text, &file_proto)",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x8f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_158,local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  pDVar4 = std::
           unique_ptr<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase,_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase>_>
           ::operator->(&this->test_case_);
  iVar2 = (*pDVar4->_vptr_DescriptorDatabaseTestCase[3])(pDVar4,&gtest_ar_.message_);
  local_189 = (bool)(~(byte)iVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_188,&local_189,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1c0,(internal *)local_188,
               (AssertionResult *)"test_case_->AddToDatabase(file_proto)","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x90,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar_.message_);
  return;
}

Assistant:

void AddToDatabaseWithError(const char* file_descriptor_text) {
    FileDescriptorProto file_proto;
    EXPECT_TRUE(TextFormat::ParseFromString(file_descriptor_text, &file_proto));
    EXPECT_FALSE(test_case_->AddToDatabase(file_proto));
  }